

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::dumpModuleProcesses
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  int iVar1;
  size_type sVar2;
  const_reference ppcVar3;
  undefined1 local_80 [8];
  Instruction moduleProcessed;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  Builder *this_local;
  
  moduleProcessed.block._4_4_ = 0;
  while( true ) {
    iVar1 = moduleProcessed.block._4_4_;
    sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->moduleProcesses);
    if ((int)sVar2 <= iVar1) break;
    spv::Instruction::Instruction((Instruction *)local_80,OpModuleProcessed);
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->moduleProcesses,(long)moduleProcessed.block._4_4_);
    spv::Instruction::addStringOperand((Instruction *)local_80,*ppcVar3);
    spv::Instruction::dump((Instruction *)local_80,out);
    spv::Instruction::~Instruction((Instruction *)local_80);
    moduleProcessed.block._4_4_ = moduleProcessed.block._4_4_ + 1;
  }
  return;
}

Assistant:

void Builder::dumpModuleProcesses(std::vector<unsigned int>& out) const
{
    for (int i = 0; i < (int)moduleProcesses.size(); ++i) {
        Instruction moduleProcessed(OpModuleProcessed);
        moduleProcessed.addStringOperand(moduleProcesses[i]);
        moduleProcessed.dump(out);
    }
}